

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void SetNewArrayElements(ParseNode *pnode,RegSlot arrayLocation,ByteCodeGenerator *byteCodeGenerator
                        ,FuncInfo *funcInfo)

{
  RegSlot RVar1;
  code *pcVar2;
  ParseNode *this;
  RegSlot R1;
  bool bVar3;
  OpCode op;
  uint32 uVar4;
  ParseNodeUni *pPVar5;
  ParseNodeArrLit *pPVar6;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar7;
  AuxArray<int> *this_00;
  undefined4 *puVar8;
  ByteCodeWriter *pBVar9;
  ArenaAllocator *pAVar10;
  AuxArray<double> *this_01;
  AuxArray<unsigned_int> *pAVar11;
  AuxArray<void_*> *pAVar12;
  ParseNodeBin *pPVar13;
  bool local_1c9;
  bool local_1a9;
  bool local_18d;
  RegSlot local_18c;
  RegSlot local_188;
  RegSlot regVal_1;
  RegSlot regVal;
  RegSlot rhsLocation;
  uint spreadIndex;
  uint i;
  TrackAllocData local_168;
  AuxArray<void_*> *local_140;
  VarArray *vars;
  RegSlot local_130;
  uint32 allocSize;
  RegSlot arrLoc;
  OpCode opcode;
  undefined8 local_120;
  TrackAllocData local_118;
  uint32 local_ec;
  AuxArray<unsigned_int> *pAStack_e8;
  uint extraAlloc;
  AuxArray<unsigned_int> *spreadIndices;
  RegSlot spreadArrLoc;
  bool arrayLitOpt;
  undefined8 local_d0;
  TrackAllocData local_c8;
  AuxArray<double> *local_a0;
  AuxArray<double> *doubles;
  int32 local_90;
  int auxSize_1;
  int extraAlloc_2;
  bool arrayNumOpt;
  undefined8 local_80;
  TrackAllocData local_78;
  AuxArray<int> *local_50;
  AuxArray<int> *ints;
  int32 local_40;
  int auxSize;
  int extraAlloc_1;
  bool arrayIntOpt;
  uint uStack_34;
  bool nativeArrays;
  uint spreadCount;
  uint argCount;
  ParseNode *args;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pPStack_10;
  RegSlot arrayLocation_local;
  ParseNode *pnode_local;
  
  args = (ParseNode *)funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local._4_4_ = arrayLocation;
  pPStack_10 = pnode;
  pPVar5 = ParseNode::AsParseNodeUni(pnode);
  _spreadCount = pPVar5->pnode1;
  pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
  uStack_34 = pPVar6->count;
  pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
  extraAlloc_1 = pPVar6->spreadCount;
  auxSize._3_1_ = CreateNativeArrays((ByteCodeGenerator *)funcInfo_local,(FuncInfo *)args);
  local_18d = false;
  if ((bool)auxSize._3_1_) {
    pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
    local_18d = ((byte)pPVar6->field_0x20 >> 1 & 1) != 0;
  }
  auxSize._2_1_ = local_18d;
  if (local_18d != false) {
    local_40 = 0;
    ints._4_4_ = 0;
    bVar3 = Int32Math::Mul(uStack_34,4,&local_40);
    if ((!bVar3) && (bVar3 = Int32Math::Add(4,local_40,(int32 *)((long)&ints + 4)), !bVar3)) {
      pAVar7 = &ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_78,(type_info *)&Js::AuxArray<int>::typeinfo,(long)local_40,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                 ,0x23a4);
      pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar7,&local_78);
      _extraAlloc_2 = Memory::ArenaAllocator::Alloc;
      local_80 = 0;
      this_00 = (AuxArray<int> *)new<Memory::ArenaAllocator>(4,(ArenaAllocator *)pAVar7,0x3f67b0,0);
      Js::AuxArray<int>::AuxArray(this_00,uStack_34);
      local_50 = this_00;
      EmitConstantArgsToIntArray
                ((ByteCodeGenerator *)funcInfo_local,(int32 *)(this_00 + 1),_spreadCount,uStack_34);
      pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
      if (((byte)pPVar6->field_0x20 >> 3 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x23a6,"(!pnode->AsParseNodeArrLit()->hasMissingValues)",
                           "!pnode->AsParseNodeArrLit()->hasMissingValues");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::Auxiliary
                (pBVar9,NewScIntArray,pPStack_10->location,local_50,ints._4_4_,uStack_34);
      pAVar10 = ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local);
      Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<int>>
                (pAVar10,local_50,(long)local_40);
      return;
    }
    Math::DefaultOverflowPolicy();
  }
  local_1a9 = false;
  if ((auxSize._3_1_ & 1) != 0) {
    pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
    local_1a9 = ((byte)pPVar6->field_0x20 >> 2 & 1) != 0;
  }
  auxSize_1._3_1_ = local_1a9;
  if (local_1a9 != false) {
    local_90 = 0;
    doubles._4_4_ = 0;
    bVar3 = Int32Math::Mul(uStack_34,8,&local_90);
    if ((!bVar3) && (bVar3 = Int32Math::Add(8,local_90,(int32 *)((long)&doubles + 4)), !bVar3)) {
      pAVar7 = &ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_c8,(type_info *)&Js::AuxArray<double>::typeinfo,(long)local_90,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                 ,0x23ba);
      pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar7,&local_c8);
      _spreadArrLoc = Memory::ArenaAllocator::Alloc;
      local_d0 = 0;
      this_01 = (AuxArray<double> *)
                new<Memory::ArenaAllocator>(8,(ArenaAllocator *)pAVar7,0x3f67b0,0);
      Js::AuxArray<double>::AuxArray(this_01,uStack_34);
      local_a0 = this_01;
      EmitConstantArgsToFltArray
                ((ByteCodeGenerator *)funcInfo_local,(double *)(this_01 + 1),_spreadCount,uStack_34)
      ;
      pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
      if (((byte)pPVar6->field_0x20 >> 3 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x23bc,"(!pnode->AsParseNodeArrLit()->hasMissingValues)",
                           "!pnode->AsParseNodeArrLit()->hasMissingValues");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::Auxiliary
                (pBVar9,NewScFltArray,pPStack_10->location,local_a0,doubles._4_4_,uStack_34);
      pAVar10 = ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local);
      Memory::
      DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<double>>
                (pAVar10,local_a0,(long)local_90);
      return;
    }
    Math::DefaultOverflowPolicy();
  }
  pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
  local_1c9 = false;
  if ((pPVar6->field_0x20 & 1) != 0) {
    pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
    local_1c9 = 1 < pPVar6->count;
  }
  spreadIndices._7_1_ = local_1c9;
  if ((local_1c9 != false) && ((auxSize._3_1_ & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x23c8,"(!arrayLitOpt || !nativeArrays)","!arrayLitOpt || !nativeArrays");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  spreadIndices._0_4_ = byteCodeGenerator_local._4_4_;
  pAStack_e8 = (AuxArray<unsigned_int> *)0x0;
  local_ec = UInt32Math::Mul(extraAlloc_1,4);
  pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
  if (pPVar6->spreadCount != 0) {
    byteCodeGenerator_local._4_4_ = FuncInfo::AcquireTmpRegister((FuncInfo *)args);
    pAVar7 = &ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_118,(type_info *)&Js::AuxArray<unsigned_int>::typeinfo,(ulong)local_ec,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
               ,0x23d0);
    pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar7,&local_118);
    _arrLoc = Memory::ArenaAllocator::Alloc;
    local_120 = 0;
    pAVar11 = (AuxArray<unsigned_int> *)
              new<Memory::ArenaAllocator>(4,(ArenaAllocator *)pAVar7,0x3f67b0,0);
    Js::AuxArray<unsigned_int>::AuxArray(pAVar11,extraAlloc_1);
    pAStack_e8 = pAVar11;
  }
  pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
  pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
  op = NewScArray;
  if (((byte)pPVar6->field_0x20 >> 3 & 1) != 0) {
    op = NewScArrayWithMissingValues;
  }
  Js::ByteCodeWriter::Reg1Unsigned1(pBVar9,op,byteCodeGenerator_local._4_4_,uStack_34);
  if (_spreadCount == (ParseNodePtr)0x0) goto LAB_00b4e5e0;
  if (uStack_34 == 1) {
    pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    bVar3 = Js::ByteCodeWriter::DoProfileNewScArrayOp(pBVar9,NewScArray);
    if (bVar3) goto LAB_00b4df9a;
    allocSize._2_2_ = StArrItemC_CI4;
    local_130 = byteCodeGenerator_local._4_4_;
  }
  else {
LAB_00b4df9a:
    if ((spreadIndices._7_1_ & 1) == 0) {
      bVar3 = Js::JavascriptArray::HasInlineHeadSegment(uStack_34);
      if (bVar3) {
        allocSize._2_2_ = StArrInlineItem_CI4;
        local_130 = byteCodeGenerator_local._4_4_;
      }
      else if (uStack_34 < 0x40001) {
        allocSize._2_2_ = StArrSegItem_CI4;
        local_130 = FuncInfo::AcquireTmpRegister((FuncInfo *)args);
        pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
        Js::ByteCodeWriter::Reg2(pBVar9,LdArrHead,local_130,byteCodeGenerator_local._4_4_);
      }
      else {
        allocSize._2_2_ = StArrItemI_CI4;
        local_130 = byteCodeGenerator_local._4_4_;
      }
    }
    else {
      allocSize._2_2_ = StArrSegItem_A;
      local_130 = FuncInfo::AcquireTmpRegister((FuncInfo *)args);
      pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::Reg2(pBVar9,LdArrHead,local_130,byteCodeGenerator_local._4_4_);
    }
  }
  if ((spreadIndices._7_1_ & 1) == 0) {
    rhsLocation = 0;
    regVal = 0;
    while (_spreadCount->nop == knopList) {
      pPVar13 = ParseNode::AsParseNodeBin(_spreadCount);
      if (pPVar13->pnode1->nop != knopEmpty) {
        pPVar13 = ParseNode::AsParseNodeBin(_spreadCount);
        Emit(pPVar13->pnode1,(ByteCodeGenerator *)funcInfo_local,(FuncInfo *)args,0,false,false);
        pPVar13 = ParseNode::AsParseNodeBin(_spreadCount);
        RVar1 = pPVar13->pnode1->location;
        pPVar13 = ParseNode::AsParseNodeBin(_spreadCount);
        local_188 = RVar1;
        if (pPVar13->pnode1->nop == knopEllipsis) {
          if (pAStack_e8 == (AuxArray<unsigned_int> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x2414,"(spreadIndices)","spreadIndices");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          local_188 = FuncInfo::AcquireTmpRegister((FuncInfo *)args);
          pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
          Js::ByteCodeWriter::Reg2(pBVar9,LdCustomSpreadIteratorList,local_188,RVar1);
          pAStack_e8[(ulong)regVal + 1].count = rhsLocation;
          regVal = regVal + 1;
        }
        pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
        Js::ByteCodeWriter::ElementUnsigned1(pBVar9,allocSize._2_2_,local_188,local_130,rhsLocation)
        ;
        pPVar13 = ParseNode::AsParseNodeBin(_spreadCount);
        if (pPVar13->pnode1->nop == knopEllipsis) {
          FuncInfo::ReleaseTmpRegister((FuncInfo *)args,local_188);
        }
        this = args;
        pPVar13 = ParseNode::AsParseNodeBin(_spreadCount);
        FuncInfo::ReleaseLoc((FuncInfo *)this,pPVar13->pnode1);
      }
      pPVar13 = ParseNode::AsParseNodeBin(_spreadCount);
      rhsLocation = rhsLocation + 1;
      _spreadCount = pPVar13->pnode2;
    }
    if (_spreadCount->nop != knopEmpty) {
      Emit(_spreadCount,(ByteCodeGenerator *)funcInfo_local,(FuncInfo *)args,0,false,false);
      RVar1 = _spreadCount->location;
      local_18c = RVar1;
      if (_spreadCount->nop == knopEllipsis) {
        local_18c = FuncInfo::AcquireTmpRegister((FuncInfo *)args);
        pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
        Js::ByteCodeWriter::Reg2(pBVar9,LdCustomSpreadIteratorList,local_18c,RVar1);
        if (pAStack_e8 == (AuxArray<unsigned_int> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x2431,"(spreadIndices)","spreadIndices");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pAStack_e8[(ulong)regVal + 1].count = rhsLocation;
      }
      pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::ElementUnsigned1(pBVar9,allocSize._2_2_,local_18c,local_130,rhsLocation);
      if (_spreadCount->nop == knopEllipsis) {
        FuncInfo::ReleaseTmpRegister((FuncInfo *)args,local_18c);
      }
      FuncInfo::ReleaseLoc((FuncInfo *)args,_spreadCount);
      rhsLocation = rhsLocation + 1;
    }
    if (uStack_34 < rhsLocation) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x243f,"(i <= argCount)","i <= argCount");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  else {
    vars._4_4_ = UInt32Math::Mul(uStack_34,8);
    pAVar7 = &ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_168,(type_info *)&Js::AuxArray<void*>::typeinfo,(ulong)vars._4_4_,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
               ,0x23fd);
    pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar7,&local_168);
    pAVar12 = (AuxArray<void_*> *)new<Memory::ArenaAllocator>(8,(ArenaAllocator *)pAVar7,0x3f67b0,0)
    ;
    Js::AuxArray<void_*>::AuxArray(pAVar12,uStack_34);
    local_140 = pAVar12;
    EmitConstantArgsToVarArray
              ((ByteCodeGenerator *)funcInfo_local,(Var *)(pAVar12 + 1),_spreadCount,uStack_34);
    pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    RVar1 = local_130;
    pAVar12 = local_140;
    uVar4 = UInt32Math::Add(8,vars._4_4_);
    Js::ByteCodeWriter::Auxiliary(pBVar9,StArrSegItem_A,RVar1,pAVar12,uVar4,uStack_34);
    pAVar10 = ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local);
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<void*>>
              (pAVar10,local_140,(ulong)vars._4_4_);
  }
  if (local_130 != byteCodeGenerator_local._4_4_) {
    FuncInfo::ReleaseTmpRegister((FuncInfo *)args,local_130);
  }
LAB_00b4e5e0:
  pPVar6 = ParseNode::AsParseNodeArrLit(pPStack_10);
  if (pPVar6->spreadCount != 0) {
    pBVar9 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    R1 = byteCodeGenerator_local._4_4_;
    RVar1 = (RegSlot)spreadIndices;
    pAVar11 = pAStack_e8;
    uVar4 = UInt32Math::Add(4,local_ec);
    Js::ByteCodeWriter::Reg2Aux(pBVar9,SpreadArrayLiteral,RVar1,R1,pAVar11,uVar4,local_ec);
    pAVar10 = ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<unsigned_int>>
              (pAVar10,pAStack_e8,(ulong)local_ec);
    FuncInfo::ReleaseTmpRegister((FuncInfo *)args,byteCodeGenerator_local._4_4_);
  }
  return;
}

Assistant:

void SetNewArrayElements(ParseNode *pnode, Js::RegSlot arrayLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    ParseNode *args = pnode->AsParseNodeUni()->pnode1;
    uint argCount = pnode->AsParseNodeArrLit()->count;
    uint spreadCount = pnode->AsParseNodeArrLit()->spreadCount;
    bool nativeArrays = CreateNativeArrays(byteCodeGenerator, funcInfo);

    bool arrayIntOpt = nativeArrays && pnode->AsParseNodeArrLit()->arrayOfInts;
    if (arrayIntOpt)
    {
        int extraAlloc = 0, auxSize = 0;
        if (Int32Math::Mul(argCount, sizeof(int32), &extraAlloc)
            || Int32Math::Add(sizeof(Js::AuxArray<int>), extraAlloc, &auxSize))
        {
            ::Math::DefaultOverflowPolicy();
        }
        Js::AuxArray<int> *ints = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<int32>, argCount);
        EmitConstantArgsToIntArray(byteCodeGenerator, ints->elements, args, argCount);
        Assert(!pnode->AsParseNodeArrLit()->hasMissingValues);
        byteCodeGenerator->Writer()->Auxiliary(
            Js::OpCode::NewScIntArray,
            pnode->location,
            ints,
            auxSize,
            argCount);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, ints);
        return;
    }

    bool arrayNumOpt = nativeArrays && pnode->AsParseNodeArrLit()->arrayOfNumbers;
    if (arrayNumOpt)
    {
        int extraAlloc = 0, auxSize = 0;
        if (Int32Math::Mul(argCount, sizeof(double), &extraAlloc)
            || Int32Math::Add(sizeof(Js::AuxArray<double>), extraAlloc, &auxSize))
        {
            ::Math::DefaultOverflowPolicy();
        }
        Js::AuxArray<double> *doubles = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<double>, argCount);
        EmitConstantArgsToFltArray(byteCodeGenerator, doubles->elements, args, argCount);
        Assert(!pnode->AsParseNodeArrLit()->hasMissingValues);
        byteCodeGenerator->Writer()->Auxiliary(
            Js::OpCode::NewScFltArray,
            pnode->location,
            doubles,
            auxSize,
            argCount);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, doubles);
        return;
    }

    bool arrayLitOpt = pnode->AsParseNodeArrLit()->arrayOfTaggedInts && pnode->AsParseNodeArrLit()->count > 1;
    Assert(!arrayLitOpt || !nativeArrays);

    Js::RegSlot spreadArrLoc = arrayLocation;
    Js::AuxArray<uint32> *spreadIndices = nullptr;
    const uint extraAlloc = UInt32Math::Mul(spreadCount, sizeof(uint32));
    if (pnode->AsParseNodeArrLit()->spreadCount > 0)
    {
        arrayLocation = funcInfo->AcquireTmpRegister();
        spreadIndices = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<uint32>, spreadCount);
    }

    byteCodeGenerator->Writer()->Reg1Unsigned1(
        pnode->AsParseNodeArrLit()->hasMissingValues ? Js::OpCode::NewScArrayWithMissingValues : Js::OpCode::NewScArray,
        arrayLocation,
        argCount);

    if (args != nullptr)
    {
        Js::OpCode opcode;
        Js::RegSlot arrLoc;
        if (argCount == 1 && !byteCodeGenerator->Writer()->DoProfileNewScArrayOp(Js::OpCode::NewScArray))
        {
            opcode = Js::OpCode::StArrItemC_CI4;
            arrLoc = arrayLocation;
        }
        else if (arrayLitOpt)
        {
            opcode = Js::OpCode::StArrSegItem_A;
            arrLoc = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdArrHead, arrLoc, arrayLocation);
        }
        else if (Js::JavascriptArray::HasInlineHeadSegment(argCount))
        {
            // The head segment will be allocated inline as an interior pointer. To keep the array alive, the set operation
            // should be done relative to the array header to keep it alive (instead of the array segment).
            opcode = Js::OpCode::StArrInlineItem_CI4;
            arrLoc = arrayLocation;
        }
        else if (argCount <= Js::JavascriptArray::MaxInitialDenseLength)
        {
            opcode = Js::OpCode::StArrSegItem_CI4;
            arrLoc = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdArrHead, arrLoc, arrayLocation);
        }
        else
        {
            opcode = Js::OpCode::StArrItemI_CI4;
            arrLoc = arrayLocation;
        }

        if (arrayLitOpt)
        {
            uint32 allocSize = UInt32Math::Mul(argCount, sizeof(Js::Var));
            Js::VarArray *vars = AnewPlus(byteCodeGenerator->GetAllocator(), allocSize, Js::VarArray, argCount);

            EmitConstantArgsToVarArray(byteCodeGenerator, vars->elements, args, argCount);

            // Generate the opcode with vars
            byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::StArrSegItem_A, arrLoc, vars, UInt32Math::Add(sizeof(Js::VarArray), allocSize), argCount);

            AdeletePlus(byteCodeGenerator->GetAllocator(), allocSize, vars);
        }
        else
        {
            uint i = 0;
            unsigned spreadIndex = 0;
            Js::RegSlot rhsLocation;
            while (args->nop == knopList)
            {
                if (args->AsParseNodeBin()->pnode1->nop != knopEmpty)
                {
                    Emit(args->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
                    rhsLocation = args->AsParseNodeBin()->pnode1->location;
                    Js::RegSlot regVal = rhsLocation;
                    if (args->AsParseNodeBin()->pnode1->nop == knopEllipsis)
                    {
                        AnalysisAssert(spreadIndices);
                        regVal = funcInfo->AcquireTmpRegister();
                        byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdCustomSpreadIteratorList, regVal, rhsLocation);
                        spreadIndices->elements[spreadIndex++] = i;
                    }

                    byteCodeGenerator->Writer()->ElementUnsigned1(opcode, regVal, arrLoc, i);

                    if (args->AsParseNodeBin()->pnode1->nop == knopEllipsis)
                    {
                        funcInfo->ReleaseTmpRegister(regVal);
                    }

                    funcInfo->ReleaseLoc(args->AsParseNodeBin()->pnode1);
                }

                args = args->AsParseNodeBin()->pnode2;
                i++;
            }

            if (args->nop != knopEmpty)
            {
                Emit(args, byteCodeGenerator, funcInfo, false);
                rhsLocation = args->location;
                Js::RegSlot regVal = rhsLocation;
                if (args->nop == knopEllipsis)
                {
                    regVal = funcInfo->AcquireTmpRegister();
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdCustomSpreadIteratorList, regVal, rhsLocation);
                    AnalysisAssert(spreadIndices);
                    spreadIndices->elements[spreadIndex] = i;
                }

                byteCodeGenerator->Writer()->ElementUnsigned1(opcode, regVal, arrLoc, i);

                if (args->nop == knopEllipsis)
                {
                    funcInfo->ReleaseTmpRegister(regVal);
                }

                funcInfo->ReleaseLoc(args);
                i++;
            }
            Assert(i <= argCount);
        }

        if (arrLoc != arrayLocation)
        {
            funcInfo->ReleaseTmpRegister(arrLoc);
        }
    }

    if (pnode->AsParseNodeArrLit()->spreadCount > 0)
    {
        byteCodeGenerator->Writer()->Reg2Aux(Js::OpCode::SpreadArrayLiteral, spreadArrLoc, arrayLocation, spreadIndices, UInt32Math::Add(sizeof(Js::AuxArray<uint32>), extraAlloc), extraAlloc);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, spreadIndices);
        funcInfo->ReleaseTmpRegister(arrayLocation);
    }
}